

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvpair.c
# Opt level: O2

nvpair_t * nvpair_move_string(char *name,char *value)

{
  int iVar1;
  size_t sVar2;
  nvpair_t *pnVar3;
  int *piVar4;
  
  if (value == (char *)0x0) {
    piVar4 = __errno_location();
    *piVar4 = 0x16;
  }
  else {
    sVar2 = strlen(value);
    pnVar3 = nvpair_allocv(name,4,(uint64_t)value,sVar2 + 1,0);
    if (pnVar3 != (nvpair_t *)0x0) {
      return pnVar3;
    }
    piVar4 = __errno_location();
    iVar1 = *piVar4;
    free(value);
    *piVar4 = iVar1;
  }
  return (nvpair_t *)0x0;
}

Assistant:

nvpair_t *
nvpair_move_string(const char *name, char *value)
{
	nvpair_t *nvp;

	if (value == NULL) {
		ERRNO_SET(EINVAL);
		return (NULL);
	}

	nvp = nvpair_allocv(name, NV_TYPE_STRING, (uint64_t)(uintptr_t)value,
	    strlen(value) + 1, 0);
	if (nvp == NULL) {
		ERRNO_SAVE();
		nv_free(value);
		ERRNO_RESTORE();
	}

	return (nvp);
}